

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O1

void nhr_response_parse_transfer_encoding(nhr_response r,char *received)

{
  char *pcVar1;
  
  pcVar1 = nhr_response_find_http_field_value(received,k_nhr_transfer_encoding);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strstr(pcVar1,k_nhr_chunked);
    if (pcVar1 != (char *)0x0) {
      r->transfer_encoding = r->transfer_encoding | 1;
    }
  }
  return;
}

Assistant:

void nhr_response_parse_transfer_encoding(nhr_response r, char * received) {
	char * encoding = nhr_response_find_http_field_value(received, k_nhr_transfer_encoding);
	if (!encoding) {
		return;
	}

	if (strstr(encoding, k_nhr_chunked)) {
#if defined(NHR_NO_RECV_CHUNKS)
		nhr_response_log_unprocessed(k_nhr_transfer_encoding, encoding);
#else
		r->transfer_encoding |= NHR_TRANSFER_ENCODING_CHUNKED;
#endif
	}
}